

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cc
# Opt level: O2

void __thiscall avro::Validator::setCount(Validator *this,int64_t count)

{
  Exception *pEVar1;
  allocator<char> local_39;
  string local_38;
  
  if (this->waitingForCount_ == false) {
    pEVar1 = (Exception *)__cxa_allocate_exception(0x18);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Not expecting count",&local_39);
    Exception::Exception(pEVar1,&local_38);
    __cxa_throw(pEVar1,&Exception::typeinfo,Exception::~Exception);
  }
  if (-1 < this->count_) {
    this->count_ = count;
    doAdvance(this);
    return;
  }
  pEVar1 = (Exception *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Count cannot be negative",&local_39);
  Exception::Exception(pEVar1,&local_38);
  __cxa_throw(pEVar1,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void
Validator::setCount(int64_t count) 
{
    if(!waitingForCount_) {
        throw Exception("Not expecting count");
    }
    else if(count_ < 0) {
        throw Exception("Count cannot be negative");
    }
    count_ = count;

    doAdvance();
}